

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_expr.cc
# Opt level: O0

string * __thiscall Expr::DataTypeStr_abi_cxx11_(Expr *this,Env *env)

{
  undefined8 uVar1;
  char *pcVar2;
  Object *in_RSI;
  string *in_RDI;
  Type *type;
  Env *in_stack_00000100;
  Expr *in_stack_00000108;
  string *msg;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffffb4;
  char local_40 [32];
  Type *local_20;
  
  msg = in_RDI;
  local_20 = DataType(in_stack_00000108,in_stack_00000100);
  if (local_20 == (Type *)0x0) {
    uVar3 = CONCAT13(1,(int3)in_stack_ffffffffffffffb0);
    uVar1 = __cxa_allocate_exception(0x20);
    pcVar2 = orig((Expr *)0x1351c5);
    strfmt_abi_cxx11_(local_40,"cannot find data type for expression `%s\'",pcVar2);
    Exception::Exception((Exception *)CONCAT44(in_stack_ffffffffffffffb4,uVar3),in_RSI,msg);
    __cxa_throw(uVar1,&Exception::typeinfo,Exception::~Exception);
  }
  (*(local_20->super_DataDepElement)._vptr_DataDepElement[0xb])(in_RDI);
  return msg;
}

Assistant:

string Expr::DataTypeStr(Env* env) const
	{
	Type* type = DataType(env);

	if ( ! type )
		{
		throw Exception(this, strfmt("cannot find data type for expression `%s'", orig()));
		}

	return type->DataTypeStr();
	}